

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

BreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::createBufferClone
          (RuleBasedBreakIterator *this,void *param_1,int32_t *bufferSize,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  BreakIterator *clonedBI;
  UErrorCode *status_local;
  int32_t *bufferSize_local;
  void *param_1_local;
  RuleBasedBreakIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (*bufferSize == 0) {
      *bufferSize = 1;
      this_local = (RuleBasedBreakIterator *)0x0;
    }
    else {
      iVar2 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[4])();
      this_local = (RuleBasedBreakIterator *)CONCAT44(extraout_var,iVar2);
      if (this_local == (RuleBasedBreakIterator *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        *status = U_SAFECLONE_ALLOCATED_WARNING;
      }
    }
  }
  else {
    this_local = (RuleBasedBreakIterator *)0x0;
  }
  return &this_local->super_BreakIterator;
}

Assistant:

BreakIterator *  RuleBasedBreakIterator::createBufferClone(void * /*stackBuffer*/,
                                   int32_t &bufferSize,
                                   UErrorCode &status)
{
    if (U_FAILURE(status)){
        return NULL;
    }

    if (bufferSize == 0) {
        bufferSize = 1;  // preflighting for deprecated functionality
        return NULL;
    }

    BreakIterator *clonedBI = clone();
    if (clonedBI == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        status = U_SAFECLONE_ALLOCATED_WARNING;
    }
    return (RuleBasedBreakIterator *)clonedBI;
}